

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O0

void __thiscall rengine::StandardSurface::onEvent(StandardSurface *this,Event *e)

{
  PointerEvent *this_00;
  bool bVar1;
  Type TVar2;
  pointer pRVar3;
  Node *pNVar4;
  Node *root;
  ostream *poVar5;
  void *this_01;
  vec2 local_c4;
  vec2 local_bc;
  vec2 local_b4;
  mat4 local_ac;
  undefined1 local_68 [8];
  mat4 invNodeMatrix;
  bool inv;
  PointerEvent *pe;
  Event *e_local;
  StandardSurface *this_local;
  
  TVar2 = Event::type(e);
  if (TVar2 - PointerDown < 3) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_renderer);
    if (bVar1) {
      pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
               operator->(&this->m_renderer);
      pNVar4 = Renderer::sceneRoot(pRVar3);
      if (pNVar4 != (Node *)0x0) {
        register0x00000000 = PointerEvent::from(e);
        if (this->m_pointerEventReceiver == (Node *)0x0) {
          pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
                   operator->(&this->m_renderer);
          pNVar4 = Renderer::sceneRoot(pRVar3);
          deliverPointerEventInScene(this,pNVar4,stack0xffffffffffffffe0);
        }
        else {
          invNodeMatrix.m[0xf]._3_1_ = 0;
          pNVar4 = this->m_pointerEventReceiver;
          pRVar3 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
                   operator->(&this->m_renderer);
          root = Renderer::sceneRoot(pRVar3);
          TransformNode::matrixFor(&local_ac,pNVar4,root);
          mat4::inverted((mat4 *)local_68,&local_ac,(bool *)((long)invNodeMatrix.m + 0x3f));
          this_00 = stack0xffffffffffffffe0;
          if ((invNodeMatrix.m[0xf]._3_1_ & 1) == 0) {
            vec2::vec2(&local_c4,0.0);
            PointerEvent::setPosition(this_00,local_c4);
          }
          else {
            local_bc = PointerEvent::positionInSurface(stack0xffffffffffffffe0);
            local_b4 = mat4::operator*((mat4 *)local_68,local_bc);
            PointerEvent::setPosition(this_00,local_b4);
          }
          (*(this->m_pointerEventReceiver->super_SignalEmitter)._vptr_SignalEmitter[3])
                    (this->m_pointerEventReceiver,stack0xffffffffffffffe0);
        }
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "virtual void rengine::StandardSurface::onEvent(Event *)");
    poVar5 = std::operator<<(poVar5,": unknown event type=");
    TVar2 = Event::type(e);
    this_01 = (void *)std::ostream::operator<<(poVar5,TVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void StandardSurface::onEvent(Event *e)
{

    switch (e->type()) {
    case Event::PointerDown:
    case Event::PointerUp:
    case Event::PointerMove:
        if (m_renderer && m_renderer->sceneRoot()) {
            PointerEvent *pe = PointerEvent::from(e);
            if (m_pointerEventReceiver) {
                bool inv = false;
                mat4 invNodeMatrix = TransformNode::matrixFor(m_pointerEventReceiver, m_renderer->sceneRoot()).inverted(&inv);
                if (inv)
                    pe->setPosition(invNodeMatrix * pe->positionInSurface());
                else
                    pe->setPosition(vec2());
                m_pointerEventReceiver->onPointerEvent(pe);
            } else {
                deliverPointerEventInScene(m_renderer->sceneRoot(), pe);
            }
        }
        break;
    default:
        std::cerr << __PRETTY_FUNCTION__ << ": unknown event type=" << e->type() << std::endl;
        break;
    }
}